

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

void tbl_Init(void)

{
  Card_t card_00;
  Card_t *pCVar1;
  undefined1 local_1c [8];
  Card_t card;
  int j;
  int i;
  
  stk_InitFull(&PackStack);
  stk_InitEmpty(&RestStack);
  stk_InitEmptyArray(DeskStacks,7);
  stk_InitEmptyArray(ColorStacks,4);
  Score = 0;
  for (card.m_face = CF_DOWN; (int)card.m_face < 7; card.m_face = card.m_face + CF_UP) {
    for (card.m_color = CC_SPADES; (int)card.m_color <= (int)card.m_face;
        card.m_color = card.m_color + CC_HEARTS) {
      stk_Pop(&PackStack,(Card_t *)local_1c);
      card_00.m_face = card.m_type;
      card_00.m_type = local_1c._0_4_;
      card_00.m_color = local_1c._4_4_;
      stk_PushCopy(DeskStacks + (int)card.m_face,card_00);
    }
    pCVar1 = stk_TopCard(DeskStacks + (int)card.m_face);
    pCVar1->m_face = CF_UP;
  }
  return;
}

Assistant:

void tbl_Init(void)
{
  stk_InitFull(&PackStack);
  stk_InitEmpty(&RestStack);
  stk_InitEmptyArray(DeskStacks, NUM_STACKS);
  stk_InitEmptyArray(ColorStacks, NUM_CARD_COLORS);
  Score = 0;

  // draw cards from the pack into desk
  for (int i = 0; i < NUM_STACKS; i++) {
    for (int j = 0; j <= i; j++) {
      Card_t card;
      stk_Pop(&PackStack, &card);
      stk_PushCopy(&DeskStacks[i], card);
    }
    stk_TopCard(&DeskStacks[i])->m_face = CF_UP;
  }
}